

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_RemoveOption_Test::TestBody(TApp_RemoveOption_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Option *opt_00;
  char *pcVar2;
  char *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_238;
  AssertHelper local_1c0;
  Message local_1b8 [2];
  ExtrasError *anon_var_0;
  char *pcStack_1a0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  iterator local_168;
  size_type local_160;
  string local_158;
  AssertHelper local_138;
  Message local_130;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_f0;
  Message local_e8;
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_;
  string local_c0;
  allocator local_99;
  string local_98;
  Option *local_78;
  Option *opt;
  string local_68;
  allocator local_31;
  string local_30;
  TApp_RemoveOption_Test *local_10;
  TApp_RemoveOption_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"--one",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"",(allocator *)((long)&opt + 7));
  CLI::App::add_flag(&(this->super_TApp).app,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)((long)&opt + 7));
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"--two",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c0,"",(allocator *)((long)&gtest_ar_.message_.ptr_ + 7));
  opt_00 = CLI::App::add_flag(&(this->super_TApp).app,&local_98,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  local_78 = opt_00;
  local_d9 = CLI::App::remove_option(&(this->super_TApp).app,opt_00);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d8,&local_d9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_d8,
               (AssertionResult *)"app.remove_option(opt)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x2e4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  local_121 = CLI::App::remove_option(&(this->super_TApp).app,local_78);
  local_121 = !local_121;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_120,&local_121,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_158,(internal *)local_120,(AssertionResult *)"app.remove_option(opt)","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x2e5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  gtest_msg.value._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_188,"--two",(allocator *)((long)&gtest_msg.value + 7));
  gtest_msg.value._6_1_ = 0;
  local_168 = &local_188;
  local_160 = 1;
  __l._M_len = 1;
  __l._M_array = local_168;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_168;
  do {
    local_238 = local_238 + -1;
    std::__cxx11::string::~string((string *)local_238);
  } while (local_238 != &local_188);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffe60,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffe60);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) != 0) {
      return;
    }
    pcStack_1a0 = 
    "Expected: run() throws an exception of type CLI::ExtrasError.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_1b8);
  testing::internal::AssertHelper::AssertHelper
            (&local_1c0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x2e9,pcStack_1a0);
  testing::internal::AssertHelper::operator=(&local_1c0,local_1b8);
  testing::internal::AssertHelper::~AssertHelper(&local_1c0);
  testing::Message::~Message(local_1b8);
  return;
}

Assistant:

TEST_F(TApp, RemoveOption) {
    app.add_flag("--one");
    auto opt = app.add_flag("--two");

    EXPECT_TRUE(app.remove_option(opt));
    EXPECT_FALSE(app.remove_option(opt));

    args = {"--two"};

    EXPECT_THROW(run(), CLI::ExtrasError);
}